

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conncache.c
# Opt level: O1

CURLcode Curl_conncache_add_conn(conncache *connc,connectdata *conn)

{
  Curl_easy *pCVar1;
  conncache *h;
  long lVar2;
  connectbundle *pcVar3;
  connectbundle *p;
  size_t key_len;
  size_t extraout_RDX;
  size_t len;
  CURLcode CVar4;
  bool bVar5;
  undefined1 auVar6 [16];
  char key [128];
  char acStack_b8 [136];
  
  pCVar1 = conn->data;
  pcVar3 = Curl_conncache_find_bundle(conn,(pCVar1->state).conn_cache);
  if (pcVar3 != (connectbundle *)0x0) goto LAB_0055f726;
  auVar6 = (undefined1  [16])(*Curl_cmalloc)(0x30);
  len = auVar6._8_8_;
  p = auVar6._0_8_;
  if (p == (connectbundle *)0x0) {
    CVar4 = CURLE_OUT_OF_MEMORY;
  }
  else {
    p->num_connections = 0;
    p->multiuse = 0;
    Curl_llist_init(&p->conn_list,conn_llist_dtor);
    CVar4 = CURLE_OK;
    len = extraout_RDX;
  }
  if (p == (connectbundle *)0x0) {
LAB_0055f720:
    pcVar3 = (connectbundle *)0x0;
    bVar5 = false;
  }
  else {
    hashkey(conn,acStack_b8,len);
    h = (pCVar1->state).conn_cache;
    key_len = strlen(acStack_b8);
    pcVar3 = (connectbundle *)Curl_hash_add(&h->hash,acStack_b8,key_len,p);
    bVar5 = pcVar3 != (connectbundle *)0x0;
    if (bVar5) {
      pcVar3 = p;
    }
    CVar4 = CURLE_OUT_OF_MEMORY;
    if (p != (connectbundle *)0x0 && !bVar5) {
      Curl_llist_destroy(&p->conn_list,(void *)0x0);
      (*Curl_cfree)(p);
      goto LAB_0055f720;
    }
  }
  if (!bVar5) {
    return CVar4;
  }
LAB_0055f726:
  Curl_llist_insert_next(&pcVar3->conn_list,(pcVar3->conn_list).tail,conn,&conn->bundle_node);
  conn->bundle = pcVar3;
  pcVar3->num_connections = pcVar3->num_connections + 1;
  lVar2 = connc->next_connection_id;
  connc->next_connection_id = lVar2 + 1;
  conn->connection_id = lVar2;
  connc->num_connections = connc->num_connections + 1;
  return CURLE_OK;
}

Assistant:

CURLcode Curl_conncache_add_conn(struct conncache *connc,
                                 struct connectdata *conn)
{
  CURLcode result;
  struct connectbundle *bundle;
  struct connectbundle *new_bundle = NULL;
  struct Curl_easy *data = conn->data;

  bundle = Curl_conncache_find_bundle(conn, data->state.conn_cache);
  if(!bundle) {
    int rc;
    char key[128];

    result = bundle_create(data, &new_bundle);
    if(result)
      return result;

    hashkey(conn, key, sizeof(key));
    rc = conncache_add_bundle(data->state.conn_cache, key, new_bundle);

    if(!rc) {
      bundle_destroy(new_bundle);
      return CURLE_OUT_OF_MEMORY;
    }
    bundle = new_bundle;
  }

  result = bundle_add_conn(bundle, conn);
  if(result) {
    if(new_bundle)
      conncache_remove_bundle(data->state.conn_cache, new_bundle);
    return result;
  }

  conn->connection_id = connc->next_connection_id++;
  connc->num_connections++;

  DEBUGF(infof(conn->data, "Added connection %ld. "
               "The cache now contains %" CURL_FORMAT_CURL_OFF_TU " members\n",
               conn->connection_id, (curl_off_t) connc->num_connections));

  return CURLE_OK;
}